

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_attribute.c
# Opt level: O0

value attribute_metadata(attribute_conflict attr)

{
  attribute_conflict attr_00;
  klass pcVar1;
  char *pcVar2;
  type ptVar3;
  value v;
  value *v_map;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  value local_8;
  
  local_8 = value_create_map(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    attr_00 = (attribute_conflict)value_to_map((value)0x107eac);
    pcVar1 = (klass)attribute_metadata_name(attr_00);
    attr_00->cls = pcVar1;
    if (attr_00->cls == (klass)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (value)0x0;
    }
    else {
      pcVar2 = (char *)type_metadata((type_conflict)attr_00);
      attr_00->name = pcVar2;
      if (attr_00->name == (char *)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (value)0x0;
      }
      else {
        ptVar3 = (type)attribute_metadata_visibility(attr_00);
        attr_00->t = ptVar3;
        if (attr_00->t == (type)0x0) {
          value_type_destroy(in_stack_00000050);
          local_8 = (value)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

value attribute_metadata(attribute attr)
{
	/* The structure of the attribute is:
	* {
	*	"name": "attr1",
	*	"type": { "name": "", "id": 18 },
	*	"visibility": "public"
	* }
	*/
	value *v_map, v = value_create_map(NULL, 3);

	if (v == NULL)
	{
		return NULL;
	}

	v_map = value_to_map(v);

	v_map[0] = attribute_metadata_name(attr);

	if (v_map[0] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	v_map[1] = type_metadata(attr->t);

	if (v_map[1] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	v_map[2] = attribute_metadata_visibility(attr);

	if (v_map[2] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	return v;
}